

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

Status cmsys::SystemTools::CopyFileAlways(string *source,string *destination)

{
  bool bVar1;
  Status SVar2;
  Status SVar3;
  Status SVar4;
  ulong uVar5;
  mode_t perm;
  string real_destination;
  string destination_dir;
  string source_name;
  string local_40;
  
  perm = 0;
  SVar2 = GetPermissions(source,&perm);
  std::__cxx11::string::string((string *)&real_destination,(string *)destination);
  bVar1 = FileIsDirectory(source);
  if (bVar1) {
    SVar3 = MakeDirectory(destination,(mode_t *)0x0);
    SVar4 = SVar3;
  }
  else {
    destination_dir._M_dataplus._M_p = (pointer)&destination_dir.field_2;
    destination_dir._M_string_length = 0;
    destination_dir.field_2._M_local_buf[0] = '\0';
    bVar1 = FileIsDirectory(destination);
    if (bVar1) {
      std::__cxx11::string::_M_assign((string *)&destination_dir);
      ConvertToUnixSlashes(&real_destination);
      std::__cxx11::string::push_back((char)&real_destination);
      std::__cxx11::string::string((string *)&source_name,(string *)source);
      GetFilenameName(&local_40,&source_name);
      std::__cxx11::string::append((string *)&real_destination);
      std::__cxx11::string::~string((string *)&local_40);
    }
    else {
      GetFilenamePath(&source_name,destination);
      std::__cxx11::string::operator=((string *)&destination_dir,(string *)&source_name);
    }
    std::__cxx11::string::~string((string *)&source_name);
    bVar1 = SameFile(source,&real_destination);
    if (bVar1) {
      SVar3.Kind_ = Success;
      SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
      uVar5 = 0;
LAB_0012722e:
      std::__cxx11::string::~string((string *)&destination_dir);
      goto LAB_0012729b;
    }
    if (destination_dir._M_string_length != 0) {
      SVar3 = MakeDirectory(&destination_dir,(mode_t *)0x0);
      if (SVar3.Kind_ != Success) {
        uVar5 = (ulong)SVar3 >> 0x20;
        goto LAB_0012722e;
      }
    }
    SVar4 = CloneFileContent(source,&real_destination);
    if (SVar4.Kind_ == Success) {
      SVar3.Kind_ = Success;
      SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0;
    }
    else {
      SVar4 = CopyFileContentBlockwise(source,&real_destination);
      SVar3 = SVar4;
    }
    std::__cxx11::string::~string((string *)&destination_dir);
  }
  uVar5 = (ulong)SVar4 >> 0x20;
  if ((SVar3.Kind_ == Success) &&
     (SVar3.Kind_ = Success, SVar3.field_1 = (anon_union_4_1_2e27bb9a_for_Status_2)0x0,
     SVar2.Kind_ == Success)) {
    SVar3 = SetPermissions(&real_destination,perm,false);
    uVar5 = (ulong)SVar3 >> 0x20;
  }
LAB_0012729b:
  std::__cxx11::string::~string((string *)&real_destination);
  return (Status)((ulong)SVar3 & 0xffffffff | uVar5 << 0x20);
}

Assistant:

Status SystemTools::CopyFileAlways(std::string const& source,
                                   std::string const& destination)
{
  Status status;
  mode_t perm = 0;
  Status perms = SystemTools::GetPermissions(source, perm);
  std::string real_destination = destination;

  if (SystemTools::FileIsDirectory(source)) {
    status = SystemTools::MakeDirectory(destination);
    if (!status.IsSuccess()) {
      return status;
    }
  } else {
    // If destination is a directory, try to create a file with the same
    // name as the source in that directory.

    std::string destination_dir;
    if (SystemTools::FileIsDirectory(destination)) {
      destination_dir = real_destination;
      SystemTools::ConvertToUnixSlashes(real_destination);
      real_destination += '/';
      std::string source_name = source;
      real_destination += SystemTools::GetFilenameName(source_name);
    } else {
      destination_dir = SystemTools::GetFilenamePath(destination);
    }
    // If files are the same do not copy
    if (SystemTools::SameFile(source, real_destination)) {
      return status;
    }

    // Create destination directory
    if (!destination_dir.empty()) {
      status = SystemTools::MakeDirectory(destination_dir);
      if (!status.IsSuccess()) {
        return status;
      }
    }

    status = SystemTools::CloneFileContent(source, real_destination);
    // if cloning did not succeed, fall back to blockwise copy
    if (!status.IsSuccess()) {
      status = SystemTools::CopyFileContentBlockwise(source, real_destination);
    }
    if (!status.IsSuccess()) {
      return status;
    }
  }
  if (perms) {
    status = SystemTools::SetPermissions(real_destination, perm);
  }
  return status;
}